

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O2

void __thiscall glslang::TInputScanner::setString(TInputScanner *this,int newString)

{
  TSourceLoc *pTVar1;
  int iVar2;
  int iVar3;
  
  (this->logicalSourceLoc).string = newString;
  iVar3 = this->numSources + -1;
  iVar2 = this->currentSource;
  if (iVar3 < this->currentSource) {
    iVar2 = iVar3;
  }
  pTVar1 = this->loc;
  pTVar1[iVar2].string = newString;
  (this->logicalSourceLoc).name = (TString *)0x0;
  if (this->currentSource <= iVar3) {
    iVar3 = this->currentSource;
  }
  pTVar1[iVar3].name = (TString *)0x0;
  return;
}

Assistant:

void setString(int newString)
    {
        logicalSourceLoc.string = newString;
        loc[getLastValidSourceIndex()].string = newString;
        logicalSourceLoc.name = nullptr;
        loc[getLastValidSourceIndex()].name = nullptr;
    }